

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void xmlHashScanFull(xmlHashTablePtr hash,xmlHashScannerFull scan,void *data)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  xmlHashEntry *pxVar7;
  
  if ((hash != (xmlHashTablePtr)0x0) &&
     (uVar1 = hash->size, scan != (xmlHashScannerFull)0x0 && (ulong)uVar1 != 0)) {
    pxVar2 = hash->table;
    uVar6 = pxVar2->hashValue;
    pxVar7 = pxVar2;
    while (uVar6 != 0) {
      pxVar7 = pxVar7 + 1;
      if (pxVar2 + uVar1 <= pxVar7) {
        pxVar7 = pxVar2;
      }
      uVar6 = pxVar7->hashValue;
    }
    if (hash->size != 0) {
      uVar6 = 0;
      do {
        if ((pxVar7->hashValue != 0) && (pxVar7->payload != (void *)0x0)) {
          do {
            pxVar3 = pxVar7->key;
            pxVar4 = pxVar7->key2;
            pxVar5 = pxVar7->key3;
            (*scan)(pxVar7->payload,data,pxVar3,pxVar4,pxVar5);
            if ((pxVar7->hashValue == 0) || (pxVar7->payload == (void *)0x0)) break;
          } while (((pxVar7->key != pxVar3) || (pxVar7->key2 != pxVar4)) || (pxVar7->key3 != pxVar5)
                  );
        }
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = hash->table;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < hash->size);
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr hash, xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}